

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMetadata.cpp
# Opt level: O2

void __thiscall
utMetadata_get_set_string_Test_Test::TestBody(utMetadata_get_set_string_Test_Test *this)

{
  bool bVar1;
  aiMetadata *paVar2;
  char *message;
  char *in_R9;
  size_t sVar3;
  AssertionResult gtest_ar;
  AssertHelper local_878;
  AssertionResult gtest_ar__2;
  string key;
  AssertionResult gtest_ar_;
  aiString result;
  
  paVar2 = aiMetadata::Alloc(1);
  (this->super_utMetadata).m_data = paVar2;
  std::__cxx11::string::string((string *)&key,"test",(allocator *)&result);
  paVar2 = (this->super_utMetadata).m_data;
  std::__cxx11::string::string((string *)&gtest_ar_,"test",(allocator *)&gtest_ar__2);
  sVar3 = 0x3ff;
  if (((ulong)gtest_ar_.message_.ptr_ & 0xfffffc00) == 0) {
    sVar3 = (ulong)gtest_ar_.message_.ptr_ & 0xffffffff;
  }
  result.length = (ai_uint32)sVar3;
  memcpy(result.data,(void *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_),sVar3);
  result.data[sVar3] = '\0';
  bVar1 = aiMetadata::Set<aiString>(paVar2,0,&key,&result);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&result,(internal *)&gtest_ar_,(AssertionResult *)0x61577d,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0x99,(char *)CONCAT44(result.data._0_4_,result.length));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&result);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  paVar2 = (this->super_utMetadata).m_data;
  std::__cxx11::string::string((string *)&gtest_ar_,"test",(allocator *)&gtest_ar__2);
  sVar3 = 0x3ff;
  if (((ulong)gtest_ar_.message_.ptr_ & 0xfffffc00) == 0) {
    sVar3 = (ulong)gtest_ar_.message_.ptr_ & 0xffffffff;
  }
  result.length = (ai_uint32)sVar3;
  memcpy(result.data,(void *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_),sVar3);
  result.data[sVar3] = '\0';
  bVar1 = aiMetadata::Set<aiString>(paVar2,10,&key,&result);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&result,(internal *)&gtest_ar_,(AssertionResult *)0x61577d,"true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0x9c,(char *)CONCAT44(result.data._0_4_,result.length));
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&result);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  result.length = 0;
  result.data._0_4_ = result.data._0_4_ & 0xffffff00;
  memset(result.data + 1,0x1b,0x3ff);
  bVar1 = aiMetadata::Get<aiString>((this->super_utMetadata).m_data,&key,&result);
  std::__cxx11::string::string((string *)&gtest_ar__2,"test",(allocator *)&local_878);
  sVar3 = 0x3ff;
  if (((ulong)gtest_ar__2.message_.ptr_ & 0xfffffc00) == 0) {
    sVar3 = (ulong)gtest_ar__2.message_.ptr_ & 0xffffffff;
  }
  gtest_ar_._0_4_ = SUB84(sVar3,0);
  memcpy(&gtest_ar_.field_0x4,(void *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_),sVar3);
  (&gtest_ar_.field_0x4)[sVar3] = 0;
  testing::internal::CmpHelperEQ<aiString,aiString>
            ((internal *)&gtest_ar,"aiString( std::string( \"test\" ) )","result",
             (aiString *)&gtest_ar_,&result);
  std::__cxx11::string::~string((string *)&gtest_ar__2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__2.success_ = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)0x61577d,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa1,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
    testing::internal::AssertHelper::operator=(&local_878,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  paVar2 = (this->super_utMetadata).m_data;
  std::__cxx11::string::string((string *)&gtest_ar_,"bla",(allocator *)&gtest_ar__2);
  bVar1 = aiMetadata::Get<aiString>(paVar2,(string *)&gtest_ar_,&result);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar__2.success_ = !bVar1;
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)0x61577d,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_878,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMetadata.cpp"
               ,0xa4,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
    testing::internal::AssertHelper::operator=(&local_878,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_878);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  std::__cxx11::string::~string((string *)&key);
  return;
}

Assistant:

TEST_F( utMetadata, get_set_string_Test ) {
    m_data = aiMetadata::Alloc( 1 );

    unsigned int index( 0 );
    bool success( false );
    const std::string key = "test";
    success = m_data->Set( index, key, aiString( std::string( "test" ) ) );
    EXPECT_TRUE( success );

    success = m_data->Set( index+10, key, aiString( std::string( "test" ) ) );
    EXPECT_FALSE( success );

    aiString result;
    success = m_data->Get( key, result );
    EXPECT_EQ( aiString( std::string( "test" ) ), result );
    EXPECT_TRUE( success );

    success = m_data->Get( "bla", result );
    EXPECT_FALSE( success );
}